

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

faup_feature_t faup_options_field_get_feature(faup_handler_t *fh,faup_url_field_t field)

{
  long lVar1;
  long lVar2;
  faup_feature_t fVar3;
  faup_feature_t fVar4;
  
  if ((field & FAUP_URL_FIELD_SCHEME) == 0) {
    if ((field & FAUP_URL_FIELD_CREDENTIAL) == 0) {
      if ((field & FAUP_URL_FIELD_SUBDOMAIN) == 0) {
        if ((field & FAUP_URL_FIELD_DOMAIN) == 0) {
          if ((field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) == 0) {
            if ((char)field < '\0') {
              lVar2 = 0x40;
              lVar1 = 0x38;
            }
            else if ((field >> 8 & 1) == 0) {
              if ((field >> 9 & 1) == 0) {
                if ((field >> 10 & 1) == 0) {
                  if ((field >> 0xb & 1) == 0) {
                    if ((field >> 0xc & 1) == 0) {
                      fVar3.size = 0xffffffff;
                      fVar3.field = FAUP_FEATURES_FIELD_SCHEME;
                      fVar3.pos = -1;
                      return fVar3;
                    }
                    lVar2 = 0xa0;
                    lVar1 = 0x98;
                  }
                  else {
                    lVar2 = 0x94;
                    lVar1 = 0x8c;
                  }
                }
                else {
                  lVar2 = 0x88;
                  lVar1 = 0x80;
                }
              }
              else {
                lVar2 = 0x7c;
                lVar1 = 0x74;
              }
            }
            else {
              lVar2 = 0x70;
              lVar1 = 0x68;
            }
          }
          else {
            lVar2 = 0x58;
            lVar1 = 0x50;
          }
        }
        else {
          lVar2 = 0x4c;
          lVar1 = 0x44;
        }
      }
      else {
        lVar2 = 100;
        lVar1 = 0x5c;
      }
    }
    else {
      lVar2 = 0x34;
      lVar1 = 0x2c;
    }
  }
  else {
    lVar2 = 0x1c;
    lVar1 = 0x14;
  }
  fVar4.size = *(uint32_t *)((long)&(fh->faup).org_str + lVar2);
  fVar4._0_8_ = *(undefined8 *)((long)&(fh->faup).org_str + lVar1);
  return fVar4;
}

Assistant:

faup_feature_t faup_options_field_get_feature(faup_handler_t const *fh, faup_url_field_t field)
{
	faup_feature_t error;
	error.pos = -1;
	error.size = -1;

	if (field & FAUP_URL_FIELD_SCHEME) {
		return fh->faup.features.scheme;
	}
	if (field & FAUP_URL_FIELD_CREDENTIAL) {
		return fh->faup.features.credential;
	}
	if (field & FAUP_URL_FIELD_SUBDOMAIN) {
		return fh->faup.features.subdomain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN) {
		return fh->faup.features.domain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) {
		return fh->faup.features.domain_without_tld;
	}
	if (field & FAUP_URL_FIELD_HOST) {
		return fh->faup.features.host;
	}
	if (field & FAUP_URL_FIELD_TLD) {
		return fh->faup.features.tld;
	}
	if (field & FAUP_URL_FIELD_PORT) {
		return fh->faup.features.port;
	}
	if (field & FAUP_URL_FIELD_RESOURCE_PATH) {
		return fh->faup.features.resource_path;
	}
	if (field & FAUP_URL_FIELD_QUERY_STRING) {
		return fh->faup.features.query_string;
	}
	if (field & FAUP_URL_FIELD_FRAGMENT) {
		return fh->faup.features.fragment;
	}
	if (field & FAUP_URL_FIELD_URL_TYPE) {
		return error;
	}

	return error;
}